

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O3

void __thiscall
cfgfile::exception_t<cfgfile::string_trait_t>::exception_t
          (exception_t<cfgfile::string_trait_t> *this,string_t *what)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  std::logic_error::logic_error(&this->super_logic_error,(string *)what);
  *(undefined ***)this = &PTR__exception_t_0010fbe8;
  paVar1 = &(this->m_what).field_2;
  (this->m_what)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (what->_M_dataplus)._M_p;
  paVar2 = &what->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&what->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_what).field_2 + 8) = uVar4;
  }
  else {
    (this->m_what)._M_dataplus._M_p = pcVar3;
    (this->m_what).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_what)._M_string_length = what->_M_string_length;
  (what->_M_dataplus)._M_p = (pointer)paVar2;
  what->_M_string_length = 0;
  (what->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit exception_t( string_trait_t::string_t what )
		:	std::logic_error( what )
		,	m_what( std::move( what ) )
	{
	}